

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<QString_&,_const_char_(&)[29]>::convertTo<QString>
          (QStringBuilder<QString_&,_const_char_(&)[29]> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  QStringBuilder<QString_&,_const_char_(&)[29]> *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  QChar **in_stack_ffffffffffffffa8;
  QStringBuilder<QString_&,_const_char_(&)[29]> *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QString::QString((QString *)0x16e30c);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<QString_&,_const_char_(&)[29]>_>::size(p);
    p->a = (QString *)0xaaaaaaaaaaaaaaaa;
    p->b = (char (*) [29])0xaaaaaaaaaaaaaaaa;
    p[1].a = (QString *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)p,qVar3,Uninitialized);
    this_00 = QString::data_ptr((QString *)p);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<QString_&,_const_char_(&)[29]>_>::appendTo<QChar>
              (p,in_stack_ffffffffffffffa8);
    if (qVar3 != 0) {
      QString::resize((longlong)p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }